

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O3

int X509_add1_reject_object(X509 *x,ASN1_OBJECT *obj)

{
  ASN1_OBJECT *a;
  ASN1_VALUE *pAVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  
  a = OBJ_dup(obj);
  if (a == (ASN1_OBJECT *)0x0) {
    return 0;
  }
  pAVar1 = (ASN1_VALUE *)x->altname;
  if (pAVar1 == (ASN1_VALUE *)0x0) {
    pAVar1 = ASN1_item_new((ASN1_ITEM *)&X509_CERT_AUX_it);
    x->altname = (stack_st_GENERAL_NAME *)pAVar1;
  }
  sk = *(OPENSSL_STACK **)(pAVar1 + 8);
  if (sk == (OPENSSL_STACK *)0x0) {
    sk = OPENSSL_sk_new_null();
    *(OPENSSL_STACK **)(pAVar1 + 8) = sk;
    if (sk == (OPENSSL_STACK *)0x0) goto LAB_0049bc80;
  }
  sVar2 = OPENSSL_sk_push(sk,a);
  if (sVar2 != 0) {
    return 1;
  }
LAB_0049bc80:
  ASN1_OBJECT_free(a);
  return 0;
}

Assistant:

int X509_add1_reject_object(X509 *x, const ASN1_OBJECT *obj) {
  bssl::UniquePtr<ASN1_OBJECT> objtmp(OBJ_dup(obj));
  if (objtmp == nullptr) {
    return 0;
  }
  X509_CERT_AUX *aux = aux_get(x);
  if (aux->reject == nullptr) {
    aux->reject = sk_ASN1_OBJECT_new_null();
    if (aux->reject == nullptr) {
      return 0;
    }
  }
  return bssl::PushToStack(aux->reject, std::move(objtmp));
}